

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

string * duckdb::NumericHelper::ToString<unsigned_short>
                   (string *__return_storage_ptr__,unsigned_short value)

{
  uint __val;
  string *__str;
  uint __len;
  
  __len = 1;
  __val = (uint)value;
  if (((9 < value) && (__len = 2, 99 < value)) && (__len = 3, 999 < __val)) {
    __len = 5 - (__val < 10000);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p,__len,__val);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(T value) {
		return std::to_string(value);
	}